

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O3

void __thiscall
google::protobuf::TextFormat::Printer::PrintField
          (Printer *this,Message *message,Reflection *reflection,FieldDescriptor *field,
          TextGenerator *generator)

{
  bool bVar1;
  Type TVar2;
  uint uVar3;
  int iVar4;
  _Rb_tree_header *p_Var5;
  Message *message_00;
  undefined4 extraout_var_00;
  _Base_ptr p_Var6;
  vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  *pvVar7;
  ulong uVar8;
  ulong uVar9;
  char *text;
  FieldValuePrinter *pFVar10;
  vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
  local_88;
  TextGenerator *local_68;
  FieldValuePrinter *local_60;
  Reflection *local_58;
  pointer local_50;
  _Rb_tree_header *local_48;
  string *local_40;
  ulong local_38;
  undefined4 extraout_var;
  
  if ((((this->use_short_repeated_primitives_ == true) && (*(int *)(field + 0x4c) == 3)) &&
      (TVar2 = FieldDescriptor::type(field),
      *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar2 * 4) != 9)) &&
     (TVar2 = FieldDescriptor::type(field),
     *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar2 * 4) != 10)) {
    PrintShortRepeatedField(this,message,reflection,field,generator);
    return;
  }
  if (*(int *)(field + 0x4c) == 3) {
    uVar3 = (*reflection->_vptr_Reflection[6])(reflection,message,field);
  }
  else {
    uVar3 = (*reflection->_vptr_Reflection[5])(reflection,message,field);
    uVar3 = uVar3 & 0xff;
  }
  bVar1 = FieldDescriptor::is_map(field);
  local_50 = (pointer)0x0;
  local_60 = (FieldValuePrinter *)0x0;
  if (bVar1) {
    DynamicMapSorter::Sort(&local_88,message,uVar3,reflection,field);
    local_50 = local_88.
               super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_60 = (FieldValuePrinter *)
               local_88.
               super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
  }
  if (0 < (int)uVar3) {
    local_48 = &(this->custom_printers_)._M_t._M_impl.super__Rb_tree_header;
    local_40 = &generator->indent_;
    local_38 = (ulong)uVar3;
    uVar8 = 0;
    local_68 = generator;
    local_58 = reflection;
    do {
      uVar9 = 0xffffffff;
      if (*(int *)(field + 0x4c) == 3) {
        uVar9 = uVar8 & 0xffffffff;
      }
      PrintFieldName(this,message,reflection,field,generator);
      TVar2 = FieldDescriptor::type(field);
      if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar2 * 4) == 10) {
        pFVar10 = (this->default_field_value_printer_).ptr_;
        local_88.
        super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)pFVar10;
        p_Var6 = (this->custom_printers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var5 = local_48;
        if (p_Var6 != (_Base_ptr)0x0) {
          do {
            if (*(FieldDescriptor **)(p_Var6 + 1) >= field) {
              p_Var5 = (_Rb_tree_header *)p_Var6;
            }
            p_Var6 = (&p_Var6->_M_left)[*(FieldDescriptor **)(p_Var6 + 1) < field];
          } while (p_Var6 != (_Base_ptr)0x0);
          if (p_Var5 != local_48) {
            pvVar7 = (vector<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                      *)(p_Var5 + 1);
            if (field < (FieldDescriptor *)p_Var5->_M_node_count) {
              pvVar7 = &local_88;
            }
            pFVar10 = (FieldValuePrinter *)
                      (pvVar7->
                      super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                      )._M_impl.super__Vector_impl_data._M_start;
          }
        }
        if (*(int *)(field + 0x4c) == 3) {
          if (bVar1) {
            message_00 = (Message *)local_60[uVar8]._vptr_FieldValuePrinter;
          }
          else {
            iVar4 = (*local_58->_vptr_Reflection[0x34])(local_58,message,field,uVar8 & 0xffffffff);
            message_00 = (Message *)CONCAT44(extraout_var_00,iVar4);
          }
        }
        else {
          iVar4 = (*local_58->_vptr_Reflection[0x1b])(local_58,message,field,0);
          message_00 = (Message *)CONCAT44(extraout_var,iVar4);
        }
        (*(code *)((Message *)pFVar10->_vptr_FieldValuePrinter)[0xd].super_MessageLite.
                  _vptr_MessageLite)
                  (&local_88,pFVar10,message_00,uVar9,(ulong)uVar3,(ulong)this->single_line_mode_);
        TextGenerator::Print
                  (local_68,(char *)local_88.
                                    super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                   (size_t)local_88.
                           super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
        if (local_88.
            super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (pointer)&local_88.
                      super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          operator_delete(local_88.
                          super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_88.
                                super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
        }
        std::__cxx11::string::append((char *)local_40);
        Print(this,message_00,local_68);
        TextGenerator::Outdent(local_68);
        (*(code *)((Message *)pFVar10->_vptr_FieldValuePrinter)[0xe].super_MessageLite.
                  _vptr_MessageLite)
                  (&local_88,pFVar10,message_00,uVar9,(ulong)uVar3,(ulong)this->single_line_mode_);
        generator = local_68;
        TextGenerator::Print
                  (local_68,(char *)local_88.
                                    super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                                    ._M_impl.super__Vector_impl_data._M_start,
                   (size_t)local_88.
                           super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
        reflection = local_58;
        if (local_88.
            super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (pointer)&local_88.
                      super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          operator_delete(local_88.
                          super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_88.
                                super__Vector_base<const_google::protobuf::Message_*,_std::allocator<const_google::protobuf::Message_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage + 1);
        }
      }
      else {
        TextGenerator::Print(generator,": ",2);
        PrintFieldValue(this,message,reflection,field,(int)uVar9,generator);
        text = "\n";
        if (this->single_line_mode_ != false) {
          text = " ";
        }
        TextGenerator::Print(generator,text,1);
      }
      uVar8 = uVar8 + 1;
    } while (uVar8 != local_38);
  }
  if (local_60 != (FieldValuePrinter *)0x0) {
    operator_delete(local_60,(long)local_50 - (long)local_60);
  }
  return;
}

Assistant:

void TextFormat::Printer::PrintField(const Message& message,
                                     const Reflection* reflection,
                                     const FieldDescriptor* field,
                                     TextGenerator& generator) const {
  if (use_short_repeated_primitives_ &&
      field->is_repeated() &&
      field->cpp_type() != FieldDescriptor::CPPTYPE_STRING &&
      field->cpp_type() != FieldDescriptor::CPPTYPE_MESSAGE) {
    PrintShortRepeatedField(message, reflection, field, generator);
    return;
  }

  int count = 0;

  if (field->is_repeated()) {
    count = reflection->FieldSize(message, field);
  } else if (reflection->HasField(message, field)) {
    count = 1;
  }

  std::vector<const Message*> map_entries;
  const bool is_map = field->is_map();
  if (is_map) {
    map_entries = DynamicMapSorter::Sort(message, count, reflection, field);
  }

  for (int j = 0; j < count; ++j) {
    const int field_index = field->is_repeated() ? j : -1;

    PrintFieldName(message, reflection, field, generator);

    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      const FieldValuePrinter* printer = FindWithDefault(
          custom_printers_, field, default_field_value_printer_.get());
      const Message& sub_message =
          field->is_repeated()
              ? (is_map ? *map_entries[j]
                        : reflection->GetRepeatedMessage(message, field, j))
              : reflection->GetMessage(message, field);
      generator.Print(
          printer->PrintMessageStart(
              sub_message, field_index, count, single_line_mode_));
      generator.Indent();
      Print(sub_message, generator);
      generator.Outdent();
      generator.Print(
          printer->PrintMessageEnd(
              sub_message, field_index, count, single_line_mode_));
    } else {
      generator.Print(": ");
      // Write the field value.
      PrintFieldValue(message, reflection, field, field_index, generator);
      if (single_line_mode_) {
        generator.Print(" ");
      } else {
        generator.Print("\n");
      }
    }
  }
}